

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Polynomial<double>::FindRealRoots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Polynomial<double> *this)

{
  void *pvVar1;
  _Rb_tree_node_base *p_Var2;
  mapped_type_conflict *pmVar3;
  iterator iVar4;
  _Rb_tree_color _Var5;
  long lVar6;
  undefined4 uVar7;
  uint uVar8;
  uint extraout_XMM0_Dd;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  DynamicVector<double,_std::allocator<double>_> imags;
  vector<double,_std::allocator<double>_> cubeRoots;
  Polynomial<double> tempCubic;
  DynamicRectMatrix<double> companion;
  undefined8 local_158;
  undefined4 local_138;
  uint uStack_134;
  vector<double,_std::allocator<double>_> local_118;
  vector<double,_std::allocator<double>_> local_f8;
  double local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  vector<double,_std::allocator<double>_> local_a8;
  DynamicRectMatrix<double> local_90;
  DynamicRectMatrix<double> local_80;
  pointer local_70;
  pointer local_60;
  double local_48;
  uint uStack_3c;
  DynamicRectMatrix<double> local_30;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  _Var5 = _S_red;
  for (p_Var2 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if ((int)_Var5 < (int)p_Var2[1]._M_color) {
      _Var5 = p_Var2[1]._M_color;
    }
  }
  switch(_Var5) {
  case _S_black:
    dVar9 = getCoefficient(this,1);
    dVar10 = getCoefficient(this,0);
    dVar9 = -dVar10 / dVar9;
    iVar4._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_c8._0_8_ = dVar9;
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,iVar4,(double *)local_c8);
      return __return_storage_ptr__;
    }
    break;
  case 2:
    dVar9 = getCoefficient(this,2);
    dVar10 = getCoefficient(this,1);
    dVar11 = getCoefficient(this,0);
    dVar11 = dVar10 * dVar10 + dVar11 * -4.0 * dVar9;
    dVar11 = (double)(-(ulong)(1e-08 < ABS(dVar11)) & (ulong)dVar11);
    if (dVar11 < 0.0) {
      return __return_storage_ptr__;
    }
    dVar9 = 0.5 / dVar9;
    if (dVar11 <= 0.0) {
      dVar9 = dVar10 * -dVar9;
      iVar4._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_c8._0_8_ = dVar9;
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,iVar4,(double *)local_c8);
        return __return_storage_ptr__;
      }
    }
    else {
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      local_c8._0_8_ = (-dVar10 - dVar11) * dVar9;
      iVar4._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,iVar4,(double *)local_c8);
      }
      else {
        *iVar4._M_current = (double)local_c8._0_8_;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      dVar9 = dVar9 * (dVar11 - dVar10);
      iVar4._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_c8._0_8_ = dVar9;
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,iVar4,(double *)local_c8);
        return __return_storage_ptr__;
      }
    }
    break;
  case 3:
    dVar10 = getCoefficient(this,3);
    dVar11 = getCoefficient(this,2);
    dVar13 = getCoefficient(this,1);
    dVar14 = getCoefficient(this,0);
    dVar10 = 1.0 / dVar10;
    dVar11 = dVar10 * dVar11;
    dVar9 = dVar11 * 0.3333333333333333;
    dVar14 = (((dVar11 + dVar11) * dVar11 + dVar13 * dVar10 * -9.0) * dVar11 * 0.037037037037037035
             + dVar14 * dVar10) * 0.5;
    dVar10 = dVar13 * dVar10 - dVar11 * dVar9;
    dVar11 = dVar14 * dVar14 + dVar10 * dVar10 * dVar10 * 0.037037037037037035;
    dVar11 = (double)(-(ulong)(1e-08 < ABS(dVar11)) & (ulong)dVar11);
    if (dVar11 <= 0.0) {
      if (0.0 <= dVar11) {
        if (0.0 <= dVar14) {
          dVar10 = pow(dVar14,0.3333333333333333);
          uVar8 = (uint)((ulong)dVar10 >> 0x20) ^ 0x80000000;
          uVar7 = SUB84(dVar10,0);
        }
        else {
          dVar10 = pow(-dVar14,0.3333333333333333);
          uVar7 = SUB84(dVar10,0);
          uVar8 = (uint)((ulong)dVar10 >> 0x20);
        }
        local_158 = (double)CONCAT44(uVar8,uVar7);
        local_c8._0_8_ = ((double)CONCAT44(uVar8,uVar7) + (double)CONCAT44(uVar8,uVar7)) - dVar9;
        iVar4._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar4,(double *)local_c8);
        }
        else {
          *iVar4._M_current = (double)local_c8._0_8_;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        dVar9 = -local_158 - dVar9;
        iVar4._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_c8._0_8_ = dVar9;
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar4,(double *)local_c8);
        }
        else {
          *iVar4._M_current = dVar9;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar4._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_c8._0_8_ = dVar9;
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar4,(double *)local_c8);
          return __return_storage_ptr__;
        }
      }
      else {
        dVar10 = dVar10 * -0.3333333333333333;
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        if (-0.0 < dVar11) {
          dVar11 = sqrt(-dVar11);
        }
        else {
          dVar11 = SQRT(-dVar11);
        }
        dVar11 = atan2(dVar11,-dVar14);
        dVar13 = cos(dVar11 * 0.3333333333333333);
        dVar11 = sin(dVar11 * 0.3333333333333333);
        local_c8._0_8_ = (dVar10 + dVar10) * dVar13 - dVar9;
        iVar4._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar4,(double *)local_c8);
        }
        else {
          *iVar4._M_current = (double)local_c8._0_8_;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        local_c8._0_8_ = -dVar9 - (dVar11 * 1.7320508075688772 + dVar13) * dVar10;
        iVar4._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar4,(double *)local_c8);
        }
        else {
          *iVar4._M_current = (double)local_c8._0_8_;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        dVar9 = (dVar11 * -1.7320508075688772 + dVar13) * -dVar10 + -dVar9;
        iVar4._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_c8._0_8_ = dVar9;
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar4,(double *)local_c8);
          return __return_storage_ptr__;
        }
      }
    }
    else {
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      dVar10 = dVar11 - dVar14;
      if (0.0 <= dVar10) {
        dVar10 = pow(dVar10,0.3333333333333333);
        uVar7 = SUB84(dVar10,0);
        uVar8 = (uint)((ulong)dVar10 >> 0x20);
      }
      else {
        dVar10 = pow(-dVar10,0.3333333333333333);
        uVar8 = (uint)((ulong)dVar10 >> 0x20) ^ 0x80000000;
        uVar7 = SUB84(dVar10,0);
      }
      local_c8._0_8_ = CONCAT44(uVar8,uVar7);
      dVar11 = -dVar14 - dVar11;
      if (0.0 <= dVar11) {
        dVar10 = pow(dVar11,0.3333333333333333);
        local_c8._0_8_ = dVar10 + (double)local_c8._0_8_;
      }
      else {
        dVar10 = pow(-dVar11,0.3333333333333333);
        local_c8._0_8_ = (double)local_c8._0_8_ - dVar10;
      }
      dVar9 = (double)local_c8._0_8_ - dVar9;
      iVar4._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_c8._0_8_ = dVar9;
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar4,
                   (double *)local_c8);
        return __return_storage_ptr__;
      }
    }
    break;
  case 4:
    dVar10 = getCoefficient(this,4);
    local_d8 = getCoefficient(this,3);
    dVar11 = getCoefficient(this,2);
    dVar13 = getCoefficient(this,1);
    dVar14 = getCoefficient(this,0);
    local_b0 = (_Base_ptr)(local_c8 + 8);
    local_c8._8_4_ = _S_red;
    local_b8 = (_Base_ptr)0x0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_b0;
    pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)local_c8,(key_type *)&local_f8);
    dVar10 = 1.0 / dVar10;
    dVar14 = dVar14 * dVar10;
    dVar13 = dVar13 * dVar10;
    dVar11 = dVar11 * dVar10;
    dVar10 = dVar10 * local_d8;
    local_d8 = -dVar10 * dVar10;
    uStack_d0 = 0x8000000000000000;
    *pmVar3 = (local_d8 * dVar14 + dVar11 * 4.0 * dVar14) - dVar13 * dVar13;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 1;
    pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)local_c8,(key_type *)&local_f8);
    *pmVar3 = dVar10 * dVar13 + dVar14 * -4.0;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 2;
    pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)local_c8,(key_type *)&local_f8);
    local_138 = SUB84(dVar11,0);
    uStack_134 = (uint)((ulong)dVar11 >> 0x20);
    uStack_3c = extraout_XMM0_Dd ^ 0x80000000;
    local_48 = -dVar11;
    *(undefined4 *)pmVar3 = local_138;
    *(uint *)((long)pmVar3 + 4) = uStack_134 ^ 0x80000000;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_f8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,3);
    pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)local_c8,(key_type *)&local_f8);
    *pmVar3 = 1.0;
    FindRealRoots(&local_f8,(Polynomial<double> *)local_c8);
    dVar9 = *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar12 = dVar10 * 0.25 * dVar10 + local_48 + dVar9;
    dVar12 = (double)(-(ulong)(1e-08 < ABS(dVar12)) & (ulong)dVar12);
    if (dVar12 <= 0.0) {
      if ((dVar12 < 0.0) || (dVar9 = dVar9 * dVar9 + dVar14 * -4.0, dVar9 < -1e-08))
      goto LAB_00272c1b;
      dVar13 = 0.0;
      if (0.0 <= dVar9) {
        dVar13 = dVar9;
      }
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      dVar11 = dVar10 * 0.75 * dVar10 - (dVar11 + dVar11);
      dVar9 = dVar11 + dVar13 + dVar13;
      if (1e-08 <= dVar9) {
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        local_d8 = dVar10 * -0.25;
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(local_d8 + dVar9 * 0.5);
        iVar4._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar4,(double *)&local_118);
        }
        else {
          *iVar4._M_current =
               (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(local_d8 - dVar9 * 0.5);
        iVar4._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar4,(double *)&local_118);
        }
        else {
          *iVar4._M_current =
               (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
      dVar11 = dVar11 - (dVar13 + dVar13);
      if (dVar11 < 1e-08) goto LAB_00272c1b;
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(dVar10 * -0.25 + dVar11 * 0.5);
      iVar4._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,iVar4,(double *)&local_118);
      }
      else {
        *iVar4._M_current =
             (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(dVar10 * -0.25 - dVar11 * 0.5);
      iVar4._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,iVar4,(double *)&local_118);
        goto LAB_00272c1b;
      }
    }
    else {
      if (dVar12 < 0.0) {
        dVar12 = sqrt(dVar12);
      }
      else {
        dVar12 = SQRT(dVar12);
      }
      dVar14 = (dVar10 * 0.75 * dVar10 - dVar12 * dVar12) - (dVar11 + dVar11);
      local_d8 = (local_d8 * dVar10 + dVar10 * 4.0 * dVar11 + dVar13 * -8.0) / (dVar12 * 4.0);
      dVar9 = local_d8 + dVar14;
      dVar9 = (double)(-(ulong)(1e-08 < ABS(dVar9)) & (ulong)dVar9);
      if (0.0 <= dVar9) {
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        local_48 = dVar10 * -0.25;
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)((dVar12 + dVar9) * 0.5 + local_48);
        iVar4._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar4,(double *)&local_118);
        }
        else {
          *iVar4._M_current =
               (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(local_48 + (dVar12 - dVar9) * 0.5);
        iVar4._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,iVar4,(double *)&local_118);
        }
        else {
          *iVar4._M_current =
               (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
      dVar14 = dVar14 - local_d8;
      dVar14 = (double)(-(ulong)(1e-08 < ABS(dVar14)) & (ulong)dVar14);
      if (dVar14 < 0.0) goto LAB_00272c1b;
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((dVar14 - dVar12) * 0.5 + dVar10 * -0.25);
      iVar4._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,iVar4,(double *)&local_118);
      }
      else {
        *iVar4._M_current =
             (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(dVar10 * -0.25 + (dVar12 + dVar14) * -0.5);
      iVar4._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,iVar4,(double *)&local_118);
        goto LAB_00272c1b;
      }
    }
    *iVar4._M_current =
         (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
LAB_00272c1b:
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                 *)local_c8);
    return __return_storage_ptr__;
  default:
    CreateCompanion((Polynomial<double> *)&local_30);
    JAMA::Eigenvalue<double>::Eigenvalue((Eigenvalue<double> *)local_c8,&local_30);
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::reserve
              (&local_f8,(long)local_b8 - CONCAT44(local_c8._12_4_,local_c8._8_4_) >> 3);
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_f8,(vector<double,_std::allocator<double>_> *)(local_c8 + 8));
    std::vector<double,_std::allocator<double>_>::operator=(&local_118,&local_a8);
    if (0 < (int)_Var5) {
      lVar6 = 0;
      do {
        if (ABS(*(double *)
                 ((long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar6)) < 1e-08) {
          iVar4._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)__return_storage_ptr__,iVar4,
                       (double *)
                       ((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar6));
          }
          else {
            *iVar4._M_current =
                 *(double *)
                  ((long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar6);
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
        }
        lVar6 = lVar6 + 8;
      } while ((ulong)_Var5 << 3 != lVar6);
    }
    if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_70 != (pointer)0x0) {
      operator_delete(local_70,(long)local_60 - (long)local_70);
    }
    DynamicRectMatrix<double>::deallocate(&local_80);
    DynamicRectMatrix<double>::deallocate(&local_90);
    if ((_Base_ptr)
        local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (_Base_ptr)0x0) {
      operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pvVar1 = (void *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_b0 - (long)pvVar1);
    }
    DynamicRectMatrix<double>::deallocate(&local_30);
    return __return_storage_ptr__;
  }
  *iVar4._M_current = dVar9;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  return __return_storage_ptr__;
}

Assistant:

std::vector<Real> FindRealRoots() {
      const Real fEpsilon = 1.0e-8;
      std::vector<Real> roots;
      roots.clear();

      const int deg = degree();

      switch (deg) {
      case 1: {
        Real fC1 = getCoefficient(1);
        Real fC0 = getCoefficient(0);
        roots.push_back(-fC0 / fC1);
        return roots;
      }
      case 2: {
        Real fC2    = getCoefficient(2);
        Real fC1    = getCoefficient(1);
        Real fC0    = getCoefficient(0);
        Real fDiscr = fC1 * fC1 - 4.0 * fC0 * fC2;
        if (abs(fDiscr) <= fEpsilon) { fDiscr = (Real)0.0; }

        if (fDiscr < (Real)0.0) {  // complex roots only
          return roots;
        }

        Real fTmp = ((Real)0.5) / fC2;

        if (fDiscr > (Real)0.0) {  // 2 real roots
          fDiscr = sqrt(fDiscr);
          roots.push_back(fTmp * (-fC1 - fDiscr));
          roots.push_back(fTmp * (-fC1 + fDiscr));
        } else {
          roots.push_back(-fTmp * fC1);  // 1 real root
        }
      }
        return roots;
      case 3: {
        Real fC3 = getCoefficient(3);
        Real fC2 = getCoefficient(2);
        Real fC1 = getCoefficient(1);
        Real fC0 = getCoefficient(0);

        // make polynomial monic, x^3+c2*x^2+c1*x+c0
        Real fInvC3 = ((Real)1.0) / fC3;
        fC0 *= fInvC3;
        fC1 *= fInvC3;
        fC2 *= fInvC3;

        // convert to y^3+a*y+b = 0 by x = y-c2/3
        const Real fThird         = (Real)1.0 / (Real)3.0;
        const Real fTwentySeventh = (Real)1.0 / (Real)27.0;
        Real fOffset              = fThird * fC2;
        Real fA                   = fC1 - fC2 * fOffset;
        Real fB = fC0 + fC2 * (((Real)2.0) * fC2 * fC2 - ((Real)9.0) * fC1) *
                            fTwentySeventh;
        Real fHalfB = ((Real)0.5) * fB;

        Real fDiscr = fHalfB * fHalfB + fA * fA * fA * fTwentySeventh;
        if (fabs(fDiscr) <= fEpsilon) { fDiscr = (Real)0.0; }

        if (fDiscr > (Real)0.0) {  // 1 real, 2 complex roots

          fDiscr     = sqrt(fDiscr);
          Real fTemp = -fHalfB + fDiscr;
          Real root;
          if (fTemp >= (Real)0.0) {
            root = pow(fTemp, fThird);
          } else {
            root = -pow(-fTemp, fThird);
          }
          fTemp = -fHalfB - fDiscr;
          if (fTemp >= (Real)0.0) {
            root += pow(fTemp, fThird);
          } else {
            root -= pow(-fTemp, fThird);
          }
          root -= fOffset;

          roots.push_back(root);
        } else if (fDiscr < (Real)0.0) {
          const Real fSqrt3 = sqrt((Real)3.0);
          Real fDist        = sqrt(-fThird * fA);
          Real fAngle       = fThird * atan2(sqrt(-fDiscr), -fHalfB);
          Real fCos         = cos(fAngle);
          Real fSin         = sin(fAngle);
          roots.push_back(((Real)2.0) * fDist * fCos - fOffset);
          roots.push_back(-fDist * (fCos + fSqrt3 * fSin) - fOffset);
          roots.push_back(-fDist * (fCos - fSqrt3 * fSin) - fOffset);
        } else {
          Real fTemp;
          if (fHalfB >= (Real)0.0) {
            fTemp = -pow(fHalfB, fThird);
          } else {
            fTemp = pow(-fHalfB, fThird);
          }
          roots.push_back(((Real)2.0) * fTemp - fOffset);
          roots.push_back(-fTemp - fOffset);
          roots.push_back(-fTemp - fOffset);
        }
      }
        return roots;
      case 4: {
        Real fC4 = getCoefficient(4);
        Real fC3 = getCoefficient(3);
        Real fC2 = getCoefficient(2);
        Real fC1 = getCoefficient(1);
        Real fC0 = getCoefficient(0);

        // make polynomial monic, x^4+c3*x^3+c2*x^2+c1*x+c0
        Real fInvC4 = ((Real)1.0) / fC4;
        fC0 *= fInvC4;
        fC1 *= fInvC4;
        fC2 *= fInvC4;
        fC3 *= fInvC4;

        // reduction to resolvent cubic polynomial y^3+r2*y^2+r1*y+r0 = 0
        Real fR0 = -fC3 * fC3 * fC0 + ((Real)4.0) * fC2 * fC0 - fC1 * fC1;
        Real fR1 = fC3 * fC1 - ((Real)4.0) * fC0;
        Real fR2 = -fC2;
        Polynomial<Real> tempCubic;
        tempCubic.setCoefficient(0, fR0);
        tempCubic.setCoefficient(1, fR1);
        tempCubic.setCoefficient(2, fR2);
        tempCubic.setCoefficient(3, 1.0);
        std::vector<Real> cubeRoots = tempCubic.FindRealRoots();  // always
        // produces
        // at
        // least
        // one
        // root
        Real fY = cubeRoots[0];

        Real fDiscr = ((Real)0.25) * fC3 * fC3 - fC2 + fY;
        if (fabs(fDiscr) <= fEpsilon) { fDiscr = (Real)0.0; }

        if (fDiscr > (Real)0.0) {
          Real fR  = sqrt(fDiscr);
          Real fT1 = ((Real)0.75) * fC3 * fC3 - fR * fR - ((Real)2.0) * fC2;
          Real fT2 =
              (((Real)4.0) * fC3 * fC2 - ((Real)8.0) * fC1 - fC3 * fC3 * fC3) /
              (((Real)4.0) * fR);

          Real fTplus  = fT1 + fT2;
          Real fTminus = fT1 - fT2;
          if (fabs(fTplus) <= fEpsilon) { fTplus = (Real)0.0; }
          if (fabs(fTminus) <= fEpsilon) { fTminus = (Real)0.0; }

          if (fTplus >= (Real)0.0) {
            Real fD = sqrt(fTplus);
            roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * (fR + fD));
            roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * (fR - fD));
          }
          if (fTminus >= (Real)0.0) {
            Real fE = sqrt(fTminus);
            roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * (fE - fR));
            roots.push_back(-((Real)0.25) * fC3 - ((Real)0.5) * (fE + fR));
          }
        } else if (fDiscr < (Real)0.0) {
          // roots.clear();
        } else {
          Real fT2 = fY * fY - ((Real)4.0) * fC0;
          if (fT2 >= -fEpsilon) {
            if (fT2 < (Real)0.0) {  // round to zero
              fT2 = (Real)0.0;
            }
            fT2      = ((Real)2.0) * sqrt(fT2);
            Real fT1 = ((Real)0.75) * fC3 * fC3 - ((Real)2.0) * fC2;
            if (fT1 + fT2 >= fEpsilon) {
              Real fD = sqrt(fT1 + fT2);
              roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * fD);
              roots.push_back(-((Real)0.25) * fC3 - ((Real)0.5) * fD);
            }
            if (fT1 - fT2 >= fEpsilon) {
              Real fE = sqrt(fT1 - fT2);
              roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * fE);
              roots.push_back(-((Real)0.25) * fC3 - ((Real)0.5) * fE);
            }
          }
        }
      }
        return roots;
      default: {
        DynamicRectMatrix<Real> companion = CreateCompanion();
        JAMA::Eigenvalue<Real> eig(companion);
        DynamicVector<Real> reals, imags;
        eig.getRealEigenvalues(reals);
        eig.getImagEigenvalues(imags);

        for (int i = 0; i < deg; i++) {
          if (fabs(imags(i)) < fEpsilon) roots.push_back(reals(i));
        }
      }
        return roots;
      }
    }